

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  JDIMENSION JVar3;
  size_t sVar4;
  j_decompress_ptr cinfo_00;
  FILE *__s;
  undefined8 *in_RSI;
  int in_EDI;
  uint icc_len;
  JOCTET *icc_profile;
  FILE *icc_file;
  JDIMENSION tmp_1;
  JDIMENSION tmp;
  size_t nbytes;
  JDIMENSION num_scanlines;
  unsigned_long insize;
  uchar *inbuffer;
  FILE *output_file;
  FILE *input_file;
  djpeg_dest_ptr dest_mgr;
  int file_index;
  cdjpeg_progress_mgr progress;
  jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  uint *in_stack_00000558;
  JOCTET **in_stack_00000560;
  j_decompress_ptr in_stack_00000568;
  undefined4 in_stack_fffffffffffffc18;
  JDIMENSION in_stack_fffffffffffffc1c;
  j_decompress_ptr in_stack_fffffffffffffc20;
  j_decompress_ptr cinfo_01;
  boolean in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  boolean bVar5;
  j_decompress_ptr in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc3c;
  j_decompress_ptr in_stack_fffffffffffffc40;
  JDIMENSION *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  undefined8 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  JDIMENSION in_stack_fffffffffffffc64;
  j_decompress_ptr cinfo_02;
  void *local_390;
  FILE *local_388;
  FILE *local_380;
  djpeg_dest_ptr local_378;
  cdjpeg_progress_mgr local_368;
  jpeg_error_mgr local_330;
  jpeg_decompress_struct local_288;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_4 = 0;
  local_378 = (djpeg_dest_ptr)0x0;
  local_390 = (void *)0x0;
  cinfo_02 = (j_decompress_ptr)0x0;
  progname = (char *)*in_RSI;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "djpeg";
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_288.err = jpeg_std_error(&local_330);
  jpeg_CreateDecompress
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,(size_t)in_stack_fffffffffffffc30);
  local_330.addon_message_table = cdjpeg_message_table;
  local_330.first_addon_message = 1000;
  local_330.last_addon_message = 0x417;
  jpeg_set_marker_processor
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
             (jpeg_marker_parser_method)in_stack_fffffffffffffc20);
  jpeg_set_marker_processor
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
             (jpeg_marker_parser_method)in_stack_fffffffffffffc20);
  iVar1 = parse_switches((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),iVar2,
                         (char **)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                         (boolean)in_stack_fffffffffffffc48);
  if (strict != 0) {
    local_330.emit_message = my_emit_message;
  }
  if (iVar1 < local_8 + -1) {
    fprintf(_stderr,"%s: only one input file\n",progname);
    usage();
  }
  if (iVar1 < local_8) {
    local_380 = fopen((char *)local_10[iVar1],"rb");
    if (local_380 == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,local_10[iVar1]);
      exit(1);
    }
  }
  else {
    local_380 = (FILE *)read_stdin();
  }
  if (outfilename == (char *)0x0) {
    local_388 = (FILE *)write_stdout();
  }
  else {
    local_388 = fopen(outfilename,"wb");
    if (local_388 == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,outfilename);
      exit(1);
    }
  }
  if ((report != 0) || (max_scans != 0)) {
    start_progress_monitor((j_common_ptr)&local_288,&local_368);
    local_368.report = report;
    local_368.max_scans = max_scans;
  }
  if (memsrc == 0) {
    jpeg_stdio_src(in_stack_fffffffffffffc20,
                   (FILE *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  }
  else {
    do {
      local_390 = realloc(local_390,(size_t)&cinfo_02[6].comp_info);
      if (local_390 == (void *)0x0) {
        fprintf(_stderr,"%s: memory allocation failure\n",progname);
        exit(1);
      }
      sVar4 = fread((void *)((long)local_390 + (long)cinfo_02),1,0x1000,local_380);
      if ((sVar4 < 0x1000) && (iVar2 = ferror(local_380), iVar2 != 0)) {
        if (iVar1 < local_8) {
          fprintf(_stderr,"%s: can\'t read from %s\n",progname,local_10[iVar1]);
        }
        else {
          fprintf(_stderr,"%s: can\'t read from stdin\n",progname);
        }
      }
      cinfo_02 = (j_decompress_ptr)((long)&cinfo_02->err + sVar4);
    } while (sVar4 == 0x1000);
    fprintf(_stderr,"Compressed size:  %lu bytes\n",cinfo_02);
    iVar2 = (int)(sVar4 >> 0x20);
    jpeg_mem_src(in_stack_fffffffffffffc30,
                 (uchar *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                 (unsigned_long)in_stack_fffffffffffffc20);
  }
  cinfo_01 = &local_288;
  bVar5 = 1;
  jpeg_read_header(cinfo_01,in_stack_fffffffffffffc1c);
  parse_switches((j_decompress_ptr)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 iVar2,(char **)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(boolean)in_stack_fffffffffffffc48)
  ;
  cinfo_00 = (j_decompress_ptr)(ulong)requested_fmt;
  switch(cinfo_00) {
  case (j_decompress_ptr)0x0:
    local_378 = jinit_write_bmp(cinfo_00,bVar5,in_stack_fffffffffffffc28);
    break;
  case (j_decompress_ptr)0x1:
    local_378 = jinit_write_gif(cinfo_01,in_stack_fffffffffffffc1c);
    break;
  case (j_decompress_ptr)0x2:
    local_378 = jinit_write_gif(cinfo_01,in_stack_fffffffffffffc1c);
    break;
  case (j_decompress_ptr)0x3:
    local_378 = jinit_write_bmp(cinfo_00,bVar5,in_stack_fffffffffffffc28);
    break;
  case (j_decompress_ptr)0x4:
    local_378 = jinit_write_ppm(cinfo_01);
    break;
  case (j_decompress_ptr)0x5:
    local_378 = jinit_write_targa(cinfo_01);
    break;
  default:
    (local_288.err)->msg_code = 0x416;
    (*(local_288.err)->error_exit)((j_common_ptr)&local_288);
  }
  local_378->output_file = (FILE *)local_388;
  jpeg_start_decompress
            ((j_decompress_ptr)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  if (skip == 0) {
    if (crop == 0) {
      (*local_378->start_output)(&local_288,local_378);
      while (local_288.output_scanline < local_288.output_height) {
        JVar3 = jpeg_read_scanlines((j_decompress_ptr)CONCAT44(bVar5,in_stack_fffffffffffffc28),
                                    (JSAMPARRAY)cinfo_01,in_stack_fffffffffffffc1c);
        (*local_378->put_pixel_rows)(&local_288,local_378,JVar3);
      }
    }
    else {
      if ((local_288.output_width < crop_x + crop_width) ||
         (local_288.output_height < crop_y + crop_height)) {
        fprintf(_stderr,"%s: crop dimensions exceed image dimensions %d x %d\n",progname,
                (ulong)local_288.output_width,(ulong)local_288.output_height);
        exit(1);
      }
      jpeg_crop_scanline((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc48,(JDIMENSION *)in_stack_fffffffffffffc40);
      if (local_378->calc_buffer_dimensions == (_func_void_j_decompress_ptr_djpeg_dest_ptr *)0x0) {
        (local_288.err)->msg_code = 0x416;
        (*(local_288.err)->error_exit)((j_common_ptr)&local_288);
      }
      else {
        (*local_378->calc_buffer_dimensions)(&local_288,local_378);
      }
      JVar3 = local_288.output_height;
      local_288.output_height = crop_height;
      (*local_378->start_output)(&local_288,local_378);
      local_288.output_height = JVar3;
      JVar3 = jpeg_skip_scanlines(cinfo_02,in_stack_fffffffffffffc64);
      if (JVar3 != crop_y) {
        fprintf(_stderr,"%s: jpeg_skip_scanlines() returned %d rather than %d\n",progname,
                (ulong)JVar3,(ulong)crop_y);
        exit(1);
      }
      while (local_288.output_scanline < crop_y + crop_height) {
        in_stack_fffffffffffffc64 =
             jpeg_read_scanlines((j_decompress_ptr)CONCAT44(bVar5,in_stack_fffffffffffffc28),
                                 (JSAMPARRAY)cinfo_01,in_stack_fffffffffffffc1c);
        (*local_378->put_pixel_rows)(&local_288,local_378,in_stack_fffffffffffffc64);
      }
      JVar3 = jpeg_skip_scanlines(cinfo_02,in_stack_fffffffffffffc64);
      if (JVar3 != (local_288.output_height - crop_y) - crop_height) {
        fprintf(_stderr,"%s: jpeg_skip_scanlines() returned %d rather than %d\n",progname,
                (ulong)JVar3,(ulong)((local_288.output_height - crop_y) - crop_height));
        exit(1);
      }
    }
  }
  else {
    if (local_288.output_height - 1 < skip_end) {
      fprintf(_stderr,"%s: skip region exceeds image height %d\n",progname,
              (ulong)local_288.output_height);
      exit(1);
    }
    JVar3 = local_288.output_height;
    local_288.output_height = local_288.output_height - ((skip_end - skip_start) + 1);
    (*local_378->start_output)(&local_288,local_378);
    while (local_288.output_scanline < skip_start) {
      in_stack_fffffffffffffc64 =
           jpeg_read_scanlines((j_decompress_ptr)CONCAT44(bVar5,in_stack_fffffffffffffc28),
                               (JSAMPARRAY)cinfo_01,in_stack_fffffffffffffc1c);
      (*local_378->put_pixel_rows)(&local_288,local_378,in_stack_fffffffffffffc64);
    }
    JVar3 = jpeg_skip_scanlines(cinfo_02,in_stack_fffffffffffffc64);
    if (JVar3 != (skip_end - skip_start) + 1) {
      fprintf(_stderr,"%s: jpeg_skip_scanlines() returned %d rather than %d\n",progname,(ulong)JVar3
              ,(ulong)((skip_end - skip_start) + 1));
      exit(1);
    }
    while (local_288.output_scanline < local_288.output_height) {
      JVar3 = jpeg_read_scanlines((j_decompress_ptr)CONCAT44(bVar5,in_stack_fffffffffffffc28),
                                  (JSAMPARRAY)cinfo_01,in_stack_fffffffffffffc1c);
      (*local_378->put_pixel_rows)(&local_288,local_378,JVar3);
    }
  }
  if ((report != 0) || (max_scans != 0)) {
    local_368.pub.completed_passes = local_368.pub.total_passes;
  }
  if (icc_filename != (char *)0x0) {
    __s = fopen(icc_filename,"wb");
    if (__s == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,icc_filename);
      exit(1);
    }
    bVar5 = jpeg_read_icc_profile(in_stack_00000568,in_stack_00000560,in_stack_00000558);
    if (bVar5 == 0) {
      if ((local_288.err)->msg_code != 0x7f) {
        fprintf(_stderr,"%s: no ICC profile data in JPEG file\n",progname);
      }
    }
    else {
      sVar4 = fwrite(in_stack_fffffffffffffc40,(ulong)in_stack_fffffffffffffc3c,1,__s);
      if (sVar4 == 0) {
        fprintf(_stderr,"%s: can\'t read ICC profile from %s\n",progname,icc_filename);
        free(in_stack_fffffffffffffc40);
        fclose(__s);
        exit(1);
      }
      free(in_stack_fffffffffffffc40);
      fclose(__s);
    }
  }
  (*local_378->finish_output)(&local_288,local_378);
  jpeg_finish_decompress
            ((j_decompress_ptr)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  jpeg_destroy_decompress((j_decompress_ptr)0x105d7b);
  if (local_380 != _stdin) {
    fclose(local_380);
  }
  if (local_388 != _stdout) {
    fclose(local_388);
  }
  if ((report != 0) || (max_scans != 0)) {
    end_progress_monitor((j_common_ptr)0x105dd0);
  }
  if (memsrc != 0) {
    free(local_390);
  }
  iVar2 = 0;
  if (local_330.num_warnings != 0) {
    iVar2 = 2;
  }
  exit(iVar2);
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  struct cdjpeg_progress_mgr progress;
  int file_index;
  djpeg_dest_ptr dest_mgr = NULL;
  FILE *input_file;
  FILE *output_file;
  unsigned char *inbuffer = NULL;
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  unsigned long insize = 0;
#endif
  JDIMENSION num_scanlines;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "djpeg";         /* in case C library doesn't provide it */

  /* Initialize the JPEG decompression object with default error handling. */
  cinfo.err = jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  /* Add some application-specific error messages (from cderror.h) */
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = JMSG_FIRSTADDONCODE;
  jerr.last_addon_message = JMSG_LASTADDONCODE;

  /* Insert custom marker processor for COM and APP12.
   * APP12 is used by some digital camera makers for textual info,
   * so we provide the ability to display it as text.
   * If you like, additional APPn marker types can be selected for display,
   * but don't try to override APP0 or APP14 this way (see libjpeg.txt).
   */
  jpeg_set_marker_processor(&cinfo, JPEG_COM, print_text_marker);
  jpeg_set_marker_processor(&cinfo, JPEG_APP0 + 12, print_text_marker);

  /* Scan command line to find file names. */
  /* It is convenient to use just one switch-parsing routine, but the switch
   * values read here are ignored; we will rescan the switches after opening
   * the input file.
   * (Exception: tracing level set here controls verbosity for COM markers
   * found during jpeg_read_header...)
   */

  file_index = parse_switches(&cinfo, argc, argv, 0, FALSE);

  if (strict)
    jerr.emit_message = my_emit_message;

#ifdef TWO_FILE_COMMANDLINE
  /* Must have either -outfile switch or explicit output file name */
  if (outfilename == NULL) {
    if (file_index != argc - 2) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
    outfilename = argv[file_index + 1];
  } else {
    if (file_index != argc - 1) {
      fprintf(stderr, "%s: must name one input and one output file\n",
              progname);
      usage();
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((input_file = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    input_file = read_stdin();
  }

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((output_file = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, outfilename);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default output file is stdout */
    output_file = write_stdout();
  }

  if (report || max_scans != 0) {
    start_progress_monitor((j_common_ptr)&cinfo, &progress);
    progress.report = report;
    progress.max_scans = max_scans;
  }

  /* Specify data source for decompression */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  if (memsrc) {
    size_t nbytes;
    do {
      inbuffer = (unsigned char *)realloc(inbuffer, insize + INPUT_BUF_SIZE);
      if (inbuffer == NULL) {
        fprintf(stderr, "%s: memory allocation failure\n", progname);
        exit(EXIT_FAILURE);
      }
      nbytes = JFREAD(input_file, &inbuffer[insize], INPUT_BUF_SIZE);
      if (nbytes < INPUT_BUF_SIZE && ferror(input_file)) {
        if (file_index < argc)
          fprintf(stderr, "%s: can't read from %s\n", progname,
                  argv[file_index]);
        else
          fprintf(stderr, "%s: can't read from stdin\n", progname);
      }
      insize += (unsigned long)nbytes;
    } while (nbytes == INPUT_BUF_SIZE);
    fprintf(stderr, "Compressed size:  %lu bytes\n", insize);
    jpeg_mem_src(&cinfo, inbuffer, insize);
  } else
#endif
    jpeg_stdio_src(&cinfo, input_file);

  /* Read file header, set default decompression parameters */
  (void)jpeg_read_header(&cinfo, TRUE);

  /* Adjust default decompression parameters by re-parsing the options */
  file_index = parse_switches(&cinfo, argc, argv, 0, TRUE);

  /* Initialize the output module now to let it override any crucial
   * option settings (for instance, GIF wants to force color quantization).
   */
  switch (requested_fmt) {
#ifdef BMP_SUPPORTED
  case FMT_BMP:
    dest_mgr = jinit_write_bmp(&cinfo, FALSE, TRUE);
    break;
  case FMT_OS2:
    dest_mgr = jinit_write_bmp(&cinfo, TRUE, TRUE);
    break;
#endif
#ifdef GIF_SUPPORTED
  case FMT_GIF:
    dest_mgr = jinit_write_gif(&cinfo, TRUE);
    break;
  case FMT_GIF0:
    dest_mgr = jinit_write_gif(&cinfo, FALSE);
    break;
#endif
#ifdef PPM_SUPPORTED
  case FMT_PPM:
    dest_mgr = jinit_write_ppm(&cinfo);
    break;
#endif
#ifdef TARGA_SUPPORTED
  case FMT_TARGA:
    dest_mgr = jinit_write_targa(&cinfo);
    break;
#endif
  default:
    ERREXIT(&cinfo, JERR_UNSUPPORTED_FORMAT);
    break;
  }
  dest_mgr->output_file = output_file;

  /* Start decompressor */
  (void)jpeg_start_decompress(&cinfo);

  /* Skip rows */
  if (skip) {
    JDIMENSION tmp;

    /* Check for valid skip_end.  We cannot check this value until after
     * jpeg_start_decompress() is called.  Note that we have already verified
     * that skip_start <= skip_end.
     */
    if (skip_end > cinfo.output_height - 1) {
      fprintf(stderr, "%s: skip region exceeds image height %d\n", progname,
              cinfo.output_height);
      exit(EXIT_FAILURE);
    }

    /* Write output file header.  This is a hack to ensure that the destination
     * manager creates an output image of the proper size.
     */
    tmp = cinfo.output_height;
    cinfo.output_height -= (skip_end - skip_start + 1);
    (*dest_mgr->start_output) (&cinfo, dest_mgr);
    cinfo.output_height = tmp;

    /* Process data */
    while (cinfo.output_scanline < skip_start) {
      num_scanlines = jpeg_read_scanlines(&cinfo, dest_mgr->buffer,
                                          dest_mgr->buffer_height);
      (*dest_mgr->put_pixel_rows) (&cinfo, dest_mgr, num_scanlines);
    }
    if ((tmp = jpeg_skip_scanlines(&cinfo, skip_end - skip_start + 1)) !=
        skip_end - skip_start + 1) {
      fprintf(stderr, "%s: jpeg_skip_scanlines() returned %d rather than %d\n",
              progname, tmp, skip_end - skip_start + 1);
      exit(EXIT_FAILURE);
    }
    while (cinfo.output_scanline < cinfo.output_height) {
      num_scanlines = jpeg_read_scanlines(&cinfo, dest_mgr->buffer,
                                          dest_mgr->buffer_height);
      (*dest_mgr->put_pixel_rows) (&cinfo, dest_mgr, num_scanlines);
    }

  /* Decompress a subregion */
  } else if (crop) {
    JDIMENSION tmp;

    /* Check for valid crop dimensions.  We cannot check these values until
     * after jpeg_start_decompress() is called.
     */
    if (crop_x + crop_width > cinfo.output_width ||
        crop_y + crop_height > cinfo.output_height) {
      fprintf(stderr, "%s: crop dimensions exceed image dimensions %d x %d\n",
              progname, cinfo.output_width, cinfo.output_height);
      exit(EXIT_FAILURE);
    }

    jpeg_crop_scanline(&cinfo, &crop_x, &crop_width);
    if (dest_mgr->calc_buffer_dimensions)
      (*dest_mgr->calc_buffer_dimensions) (&cinfo, dest_mgr);
    else
      ERREXIT(&cinfo, JERR_UNSUPPORTED_FORMAT);

    /* Write output file header.  This is a hack to ensure that the destination
     * manager creates an output image of the proper size.
     */
    tmp = cinfo.output_height;
    cinfo.output_height = crop_height;
    (*dest_mgr->start_output) (&cinfo, dest_mgr);
    cinfo.output_height = tmp;

    /* Process data */
    if ((tmp = jpeg_skip_scanlines(&cinfo, crop_y)) != crop_y) {
      fprintf(stderr, "%s: jpeg_skip_scanlines() returned %d rather than %d\n",
              progname, tmp, crop_y);
      exit(EXIT_FAILURE);
    }
    while (cinfo.output_scanline < crop_y + crop_height) {
      num_scanlines = jpeg_read_scanlines(&cinfo, dest_mgr->buffer,
                                          dest_mgr->buffer_height);
      (*dest_mgr->put_pixel_rows) (&cinfo, dest_mgr, num_scanlines);
    }
    if ((tmp =
         jpeg_skip_scanlines(&cinfo,
                             cinfo.output_height - crop_y - crop_height)) !=
        cinfo.output_height - crop_y - crop_height) {
      fprintf(stderr, "%s: jpeg_skip_scanlines() returned %d rather than %d\n",
              progname, tmp, cinfo.output_height - crop_y - crop_height);
      exit(EXIT_FAILURE);
    }

  /* Normal full-image decompress */
  } else {
    /* Write output file header */
    (*dest_mgr->start_output) (&cinfo, dest_mgr);

    /* Process data */
    while (cinfo.output_scanline < cinfo.output_height) {
      num_scanlines = jpeg_read_scanlines(&cinfo, dest_mgr->buffer,
                                          dest_mgr->buffer_height);
      (*dest_mgr->put_pixel_rows) (&cinfo, dest_mgr, num_scanlines);
    }
  }

  /* Hack: count final pass as done in case finish_output does an extra pass.
   * The library won't have updated completed_passes.
   */
  if (report || max_scans != 0)
    progress.pub.completed_passes = progress.pub.total_passes;

  if (icc_filename != NULL) {
    FILE *icc_file;
    JOCTET *icc_profile;
    unsigned int icc_len;

    if ((icc_file = fopen(icc_filename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (jpeg_read_icc_profile(&cinfo, &icc_profile, &icc_len)) {
      if (fwrite(icc_profile, icc_len, 1, icc_file) < 1) {
        fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
                icc_filename);
        free(icc_profile);
        fclose(icc_file);
        exit(EXIT_FAILURE);
      }
      free(icc_profile);
      fclose(icc_file);
    } else if (cinfo.err->msg_code != JWRN_BOGUS_ICC)
      fprintf(stderr, "%s: no ICC profile data in JPEG file\n", progname);
  }

  /* Finish decompression and release memory.
   * I must do it in this order because output module has allocated memory
   * of lifespan JPOOL_IMAGE; it needs to finish before releasing memory.
   */
  (*dest_mgr->finish_output) (&cinfo, dest_mgr);
  (void)jpeg_finish_decompress(&cinfo);
  jpeg_destroy_decompress(&cinfo);

  /* Close files, if we opened them */
  if (input_file != stdin)
    fclose(input_file);
  if (output_file != stdout)
    fclose(output_file);

  if (report || max_scans != 0)
    end_progress_monitor((j_common_ptr)&cinfo);

  if (memsrc)
    free(inbuffer);

  /* All done. */
  exit(jerr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}